

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

void Json_Write(char *pFileName,Abc_Nam_t *pStr,Vec_Wec_t *vObjs)

{
  FILE *__stream;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if (0 < vObjs->nSize) {
    Json_Write_rec((FILE *)__stream,pStr,vObjs,vObjs->pArray,1,0,1);
    fclose(__stream);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Json_Write( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    Json_Write_rec( pFile, pStr, vObjs, Vec_WecEntry(vObjs, 0), 1, 0, 1 );
    fclose( pFile );
}